

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

RPCHelpMan * echo(RPCHelpMan *__return_storage_ptr__,string *name)

{
  initializer_list<RPCArg> __l;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe8a8;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffe8b0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8c0;
  allocator_type *in_stack_ffffffffffffe8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8e8;
  undefined1 *puVar2;
  iterator in_stack_ffffffffffffe8f0;
  RPCArgOptions *in_stack_ffffffffffffe8f8;
  string *in_stack_ffffffffffffe900;
  Fallback *in_stack_ffffffffffffe908;
  undefined1 skip_type_check;
  undefined8 in_stack_ffffffffffffe910;
  Type type;
  vector<RPCResult,_std::allocator<RPCResult>_> *inner;
  string *in_stack_ffffffffffffe918;
  string *description;
  RPCArg *in_stack_ffffffffffffe920;
  RPCResult *result;
  RPCResults *this_00;
  RPCResult *this_01;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description_00;
  RPCHelpMan *this_02;
  string *name_local;
  allocator<char> local_1569;
  pointer local_1568;
  pointer pRStack_1560;
  pointer local_1558;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1542;
  undefined1 local_1522;
  undefined1 local_1521 [8];
  allocator<char> local_1519 [7];
  allocator<char> local_1512;
  allocator<char> local_1511 [7];
  allocator<char> local_150a;
  allocator<char> local_1509 [7];
  allocator<char> local_1502;
  allocator<char> local_1501 [7];
  allocator<char> local_14fa;
  allocator<char> local_14f9;
  undefined4 local_14f8;
  allocator<char> local_14f2;
  allocator<char> local_14f1;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffeb14;
  allocator<char> local_14e2;
  allocator<char> local_14e1;
  undefined1 local_14e0 [6];
  undefined1 local_14da;
  undefined1 local_14d9 [8];
  string local_14d1;
  allocator<char> local_14b1 [265];
  undefined1 local_13a8;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined1 local_1368;
  undefined1 local_1367;
  undefined1 local_12c0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined1 local_1280;
  undefined1 local_127f;
  undefined1 local_11d8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined1 local_1198;
  undefined1 local_1197;
  undefined1 local_10f0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined1 local_10b0;
  undefined1 local_10af;
  undefined1 local_1008;
  undefined8 local_1000;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined1 local_fc8;
  undefined1 local_fc7;
  undefined1 local_f20;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined1 local_ee0;
  undefined1 local_edf;
  undefined1 local_e38;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined1 local_df8;
  undefined1 local_df7;
  undefined1 local_d50;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined1 local_d10;
  undefined1 local_d0f;
  undefined1 local_c68;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined1 local_c28;
  undefined1 local_c27;
  undefined1 local_b80;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined1 local_b40;
  undefined1 local_b3f;
  undefined1 local_a98 [264];
  RPCExamples local_990 [66];
  RPCResult local_150;
  undefined1 local_48 [64];
  long local_8;
  
  type = (Type)((ulong)in_stack_ffffffffffffe910 >> 0x20);
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = __return_storage_ptr__;
  std::__cxx11::string::string(&in_stack_ffffffffffffe8f0->m_names,in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  description_00 = (string *)(local_14d9 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_14d9._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)local_14d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_b80 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_b58 = 0;
  uStack_b50 = 0;
  local_b48 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_b40 = 0;
  local_b3f = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  examples = local_990;
  results = (RPCResults *)&local_14da;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_14e0._0_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_c68 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_c40 = 0;
  uStack_c38 = 0;
  local_c30 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_c28 = 0;
  local_c27 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_d50 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_d28 = 0;
  uStack_d20 = 0;
  local_d18 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_d10 = 0;
  local_d0f = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  uVar3 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_e38 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_e10 = 0;
  uStack_e08 = 0;
  local_e00 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_df8 = 0;
  local_df7 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_14f8._0_1_ = '\x01';
  local_14f8._1_3_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_f20 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_ef8 = 0;
  uStack_ef0 = 0;
  local_ee8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_ee0 = 0;
  local_edf = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_1501[1] = (allocator<char>)0x1;
  local_1501[2] = (allocator<char>)0x0;
  local_1501[3] = (allocator<char>)0x0;
  local_1501[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_1008 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_fe0 = 0;
  uStack_fd8 = 0;
  local_fd0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_fc8 = 0;
  local_fc7 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_1509[1] = (allocator<char>)0x1;
  local_1509[2] = (allocator<char>)0x0;
  local_1509[3] = (allocator<char>)0x0;
  local_1509[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_10f0 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_10c8 = 0;
  uStack_10c0 = 0;
  local_10b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_10b0 = 0;
  local_10af = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_1511[1] = (allocator<char>)0x1;
  local_1511[2] = (allocator<char>)0x0;
  local_1511[3] = (allocator<char>)0x0;
  local_1511[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_11d8 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_11b0 = 0;
  uStack_11a8 = 0;
  local_11a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_1198 = 0;
  local_1197 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_1519[1] = (allocator<char>)0x1;
  local_1519[2] = (allocator<char>)0x0;
  local_1519[3] = (allocator<char>)0x0;
  local_1519[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_12c0 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_1298 = 0;
  uStack_1290 = 0;
  local_1288 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_1280 = 0;
  local_127f = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  this_01 = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_1521._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe8b8,(Optional *)in_stack_ffffffffffffe8b0);
  this_00 = (RPCResults *)local_1521;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_13a8 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe8c0);
  local_1380 = 0;
  uStack_1378 = 0;
  local_1370 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe8a8);
  local_1368 = 0;
  local_1367 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,type,in_stack_ffffffffffffe908,
                 in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  result = (RPCResult *)&local_1522;
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe8a8);
  __l._M_len = (size_type)in_stack_ffffffffffffe8f8;
  __l._M_array = in_stack_ffffffffffffe8f0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe8e8,__l,
             in_stack_ffffffffffffe8e0);
  description = (string *)
                ((long)&local_1542.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                        .super__Vector_impl_data._M_start + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  inner = &local_1542;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  local_1568 = (pointer)0x0;
  pRStack_1560 = (pointer)0x0;
  local_1558 = (pointer)0x0;
  skip_type_check = (undefined1)((ulong)&local_1568 >> 0x38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe8a8);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),(string *)result,description,inner,
             (bool)skip_type_check);
  RPCResults::RPCResults(this_00,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
             (allocator<char> *)in_stack_ffffffffffffe8e8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_ffffffffffffe8a8,(string *)0x1385d92);
  this = (RPCArg *)&stack0xffffffffffffea70;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<echo(std::__cxx11::string_const&)::__0,void>
            (in_stack_ffffffffffffe8b8,in_stack_ffffffffffffe8b0);
  RPCHelpMan::RPCHelpMan
            (this_02,&__return_storage_ptr__->m_name,description_00,args,results,examples,
             (RPCMethodImpl *)CONCAT44(in_stack_ffffffffffffeb14,uVar3));
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1569);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe8b8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1542);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&local_1542.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                     super__Vector_impl_data._M_start + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe8b8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_a98;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1521);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1521 + 7));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1519);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1512);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1511);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_150a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1509);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1502);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1501);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14fa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14f9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14f2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14f1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffeb16);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffeb17);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14e2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14e1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_14da);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_14d9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_14d9 + 8));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_14b1);
  std::__cxx11::string::~string(&this->m_names);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_02;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan echo(const std::string& name)
{
    return RPCHelpMan{name,
                "\nSimply echo back the input arguments. This command is for testing.\n"
                "\nIt will return an internal bug report when arg9='trigger_internal_bug' is passed.\n"
                "\nThe difference between echo and echojson is that echojson has argument conversion enabled in the client-side table in "
                "bitcoin-cli and the GUI. There is no server-side difference.",
        {
            {"arg0", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
            {"arg1", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
            {"arg2", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
            {"arg3", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
            {"arg4", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
            {"arg5", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
            {"arg6", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
            {"arg7", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
            {"arg8", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
            {"arg9", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "", RPCArgOptions{.skip_type_check = true}},
        },
                RPCResult{RPCResult::Type::ANY, "", "Returns whatever was passed in"},
                RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    if (request.params[9].isStr()) {
        CHECK_NONFATAL(request.params[9].get_str() != "trigger_internal_bug");
    }

    return request.params;
},
    };
}